

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_NtkCollectNewTfi1_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfiNew)

{
  int iVar1;
  int *piVar2;
  int *pFanins;
  int iFanin;
  int i;
  Vec_Int_t *vTfiNew_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsTravIdPrev(p,iObj);
  if ((iVar1 != 0) && (iVar1 = Acb_ObjSetTravIdCur(p,iObj), iVar1 == 0)) {
    pFanins._4_4_ = 0;
    piVar2 = Acb_ObjFanins(p,iObj);
    for (; pFanins._4_4_ < *piVar2; pFanins._4_4_ = pFanins._4_4_ + 1) {
      Acb_NtkCollectNewTfi1_rec(p,piVar2[pFanins._4_4_ + 1],vTfiNew);
    }
    Vec_IntPush(vTfiNew,iObj);
  }
  return;
}

Assistant:

void Acb_NtkCollectNewTfi1_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfiNew )
{
    int i, iFanin, * pFanins;
    if ( !Acb_ObjIsTravIdPrev(p, iObj) )
        return;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, i )
        Acb_NtkCollectNewTfi1_rec( p, iFanin, vTfiNew );
    Vec_IntPush( vTfiNew, iObj );
}